

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

int Vec_BitCount(Vec_Bit_t *p)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = p->nSize;
  uVar7 = (uint)((uVar1 & 0x1f) != 0) + ((int)uVar1 >> 5);
  piVar2 = p->pArray;
  if ((uVar1 & 0x1f) == 0) {
    uVar6 = 0;
    uVar5 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar5 = uVar6;
    }
    iVar3 = 0;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar4 = Vec_BitCountWord(piVar2[uVar6]);
      iVar3 = iVar3 + iVar4;
    }
  }
  else {
    if ((int)uVar7 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x256,"int Vec_BitCount(Vec_Bit_t *)");
    }
    iVar4 = 0;
    for (uVar5 = 0; uVar7 - 1 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = Vec_BitCountWord(piVar2[uVar5]);
      iVar4 = iVar4 + iVar3;
    }
    iVar3 = Vec_BitCountWord(~(-1 << (sbyte)(uVar1 & 0x1f)) & piVar2[uVar7 - 1]);
    iVar3 = iVar3 + iVar4;
  }
  return iVar3;
}

Assistant:

static inline int Vec_BitCount( Vec_Bit_t * p ) 
{
    unsigned * pArray = (unsigned *)p->pArray;
    int nWords = (p->nSize >> 5) + ((p->nSize & 31) > 0);
    int i, Counter = 0;
    if ( p->nSize & 31 )
    {
        assert( nWords > 0 );
        for ( i = 0; i < nWords-1; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
        Counter += Vec_BitCountWord( pArray[i] & ~(~0 << (p->nSize & 31)) );
    }
    else
    {
        for ( i = 0; i < nWords; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
    }
    return Counter;
}